

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O3

void __thiscall
asmjit::_abi_1_10::x86::rwZeroExtendGp(x86 *this,OpRWInfo *opRwInfo,Gp *reg,uint32_t nativeGpSize)

{
  byte *pbVar1;
  ulong *puVar2;
  undefined4 in_register_0000000c;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  uint uVar3;
  uint uVar4;
  
  uVar3 = (uint)opRwInfo;
  uVar4 = (uint)this;
  if ((uVar3 & 0xf07) == 1) {
    if ((uVar3 >> 0x18) + 4 == (int)reg) {
      *this = (x86)((byte)*this | 0x10);
      *(ulong *)(this + 0x18) = (ulong)((byte)this[0x10] ^ 0xff);
    }
    return;
  }
  rwZeroExtendGp();
  if (((uVar3 & 0xf8) == 0x88) &&
     (*(char *)(CONCAT44(in_register_0000000c,nativeGpSize) + 0xc) != '\0')) {
    pbVar1 = (byte *)(CONCAT44(in_register_0000000c,nativeGpSize) + 0x20);
    *pbVar1 = *pbVar1 | 1;
    *(undefined8 *)(CONCAT44(in_register_0000000c,nativeGpSize) + 0x28) = 0xff;
    if (((uVar4 >> 0x17 & 1) == 0) &&
       ((*(byte *)(CONCAT44(extraout_var,extraout_EDX) + 5) & 1) == 0)) {
      pbVar1 = (byte *)(CONCAT44(in_register_0000000c,nativeGpSize) + 0x40);
      *pbVar1 = *pbVar1 | 1;
      puVar2 = (ulong *)(CONCAT44(in_register_0000000c,nativeGpSize) + 0x48);
      *puVar2 = *puVar2 | *(ulong *)(CONCAT44(in_register_0000000c,nativeGpSize) + 0x50);
    }
  }
  return;
}

Assistant:

inline constexpr OperandSignature subset(uint32_t mask) const noexcept { return OperandSignature{_bits & mask}; }